

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_mbstr.cc
# Opt level: O3

int asn1_is_printable(uint32_t value)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0;
  if (value < 0x80) {
    iVar2 = OPENSSL_isalnum(value);
    uVar1 = 1;
    if ((iVar2 == 0) &&
       ((0x3d < value || ((0x2400fb8100000000U >> ((ulong)value & 0x3f) & 1) == 0)))) {
      uVar1 = (uint)(value == 0x3f);
    }
  }
  return uVar1;
}

Assistant:

int asn1_is_printable(uint32_t value) {
  if (value > 0x7f) {
    return 0;
  }
  return OPENSSL_isalnum(value) ||  //
         value == ' ' || value == '\'' || value == '(' || value == ')' ||
         value == '+' || value == ',' || value == '-' || value == '.' ||
         value == '/' || value == ':' || value == '=' || value == '?';
}